

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O0

bool __thiscall
Fossilize::StateReplayer::Impl::parse_graphics_pipeline_library
          (Impl *this,Value *state,VkGraphicsPipelineLibraryCreateInfoEXT **out_info)

{
  uint uVar1;
  VkGraphicsPipelineLibraryCreateInfoEXT *pVVar2;
  Type this_00;
  VkGraphicsPipelineLibraryCreateInfoEXT *info;
  VkGraphicsPipelineLibraryCreateInfoEXT **out_info_local;
  Value *state_local;
  Impl *this_local;
  
  pVVar2 = ScratchAllocator::allocate_cleared<VkGraphicsPipelineLibraryCreateInfoEXT>
                     (&this->allocator);
  *out_info = pVVar2;
  this_00 = rapidjson::
            GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
            ::operator[]<char_const>
                      ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                        *)state,"flags");
  uVar1 = rapidjson::
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::GetUint(this_00);
  pVVar2->flags = uVar1;
  return true;
}

Assistant:

bool StateReplayer::Impl::parse_graphics_pipeline_library(const Value &state,
                                                          VkGraphicsPipelineLibraryCreateInfoEXT **out_info)
{
	auto *info = allocator.allocate_cleared<VkGraphicsPipelineLibraryCreateInfoEXT>();
	*out_info = info;
	info->flags = state["flags"].GetUint();
	return true;
}